

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_or_many_heap(uint32_t number,roaring_bitmap_t **x)

{
  roaring_pq_t *pq_00;
  roaring_bitmap_t *prVar1;
  bool local_d1;
  roaring_bitmap_t *answer;
  roaring_pq_element_t X;
  roaring_pq_element_t newelement_1;
  uint64_t bsize_1;
  roaring_bitmap_t *newb_1;
  roaring_pq_element_t newelement;
  uint64_t bsize;
  _Bool temporary;
  roaring_bitmap_t *newb;
  roaring_pq_element_t x2;
  roaring_pq_element_t x1;
  roaring_pq_t *pq;
  roaring_bitmap_t **x_local;
  roaring_bitmap_t *prStack_10;
  uint32_t number_local;
  
  if (number == 0) {
    prStack_10 = roaring_bitmap_create();
  }
  else if (number == 1) {
    prStack_10 = roaring_bitmap_copy(*x);
  }
  else {
    pq_00 = create_pq(x,number);
    while (1 < pq_00->size) {
      pq_poll((roaring_pq_element_t *)&x2.bitmap,pq_00);
      pq_poll((roaring_pq_element_t *)&newb,pq_00);
      if ((((byte)x1.size & 1) == 0) || (((byte)x2.size & 1) == 0)) {
        if (((byte)x2.size & 1) == 0) {
          if (((byte)x1.size & 1) == 0) {
            prVar1 = roaring_bitmap_lazy_or
                               ((roaring_bitmap_t *)x1._8_8_,(roaring_bitmap_t *)x2._8_8_,false);
            X.bitmap = (roaring_bitmap_t *)roaring_bitmap_portable_size_in_bytes(prVar1);
            pq_add(pq_00,(roaring_pq_element_t *)&X.bitmap);
          }
          else {
            roaring_bitmap_lazy_or_inplace
                      ((roaring_bitmap_t *)x1._8_8_,(roaring_bitmap_t *)x2._8_8_,false);
            x2.bitmap = (roaring_bitmap_t *)
                        roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)x1._8_8_);
            pq_add(pq_00,(roaring_pq_element_t *)&x2.bitmap);
          }
        }
        else {
          roaring_bitmap_lazy_or_inplace
                    ((roaring_bitmap_t *)x2._8_8_,(roaring_bitmap_t *)x1._8_8_,false);
          newb = (roaring_bitmap_t *)
                 roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)x2._8_8_);
          pq_add(pq_00,(roaring_pq_element_t *)&newb);
        }
      }
      else {
        prVar1 = lazy_or_from_lazy_inputs((roaring_bitmap_t *)x1._8_8_,(roaring_bitmap_t *)x2._8_8_)
        ;
        local_d1 = prVar1 == (roaring_bitmap_t *)x1._8_8_ && prVar1 == (roaring_bitmap_t *)x2._8_8_;
        newb_1 = (roaring_bitmap_t *)roaring_bitmap_portable_size_in_bytes(prVar1);
        newelement.size._0_1_ = (local_d1 ^ 0xffU) & 1;
        newelement._8_8_ = prVar1;
        newelement.bitmap = newb_1;
        pq_add(pq_00,(roaring_pq_element_t *)&newb_1);
      }
    }
    pq_poll((roaring_pq_element_t *)&answer,pq_00);
    roaring_bitmap_repair_after_lazy((roaring_bitmap_t *)X._8_8_);
    pq_free(pq_00);
    prStack_10 = (roaring_bitmap_t *)X._8_8_;
  }
  return prStack_10;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_or_many_heap(uint32_t number,
                                              const roaring_bitmap_t **x) {
    if (number == 0) {
        return roaring_bitmap_create();
    }
    if (number == 1) {
        return roaring_bitmap_copy(x[0]);
    }
    roaring_pq_t *pq = create_pq(x, number);
    while (pq->size > 1) {
        roaring_pq_element_t x1 = pq_poll(pq);
        roaring_pq_element_t x2 = pq_poll(pq);

        if (x1.is_temporary && x2.is_temporary) {
            roaring_bitmap_t *newb =
                lazy_or_from_lazy_inputs(x1.bitmap, x2.bitmap);
            // should normally return a fresh new bitmap *except* that
            // it can return x1.bitmap or x2.bitmap in degenerate cases
            bool temporary = !((newb == x1.bitmap) && (newb == x2.bitmap));
            uint64_t bsize = roaring_bitmap_portable_size_in_bytes(newb);
            roaring_pq_element_t newelement = {
                .size = bsize, .is_temporary = temporary, .bitmap = newb};
            pq_add(pq, &newelement);
        } else if (x2.is_temporary) {
            roaring_bitmap_lazy_or_inplace(x2.bitmap, x1.bitmap, false);
            x2.size = roaring_bitmap_portable_size_in_bytes(x2.bitmap);
            pq_add(pq, &x2);
        } else if (x1.is_temporary) {
            roaring_bitmap_lazy_or_inplace(x1.bitmap, x2.bitmap, false);
            x1.size = roaring_bitmap_portable_size_in_bytes(x1.bitmap);

            pq_add(pq, &x1);
        } else {
            roaring_bitmap_t *newb =
                roaring_bitmap_lazy_or(x1.bitmap, x2.bitmap, false);
            uint64_t bsize = roaring_bitmap_portable_size_in_bytes(newb);
            roaring_pq_element_t newelement = {
                .size = bsize, .is_temporary = true, .bitmap = newb};

            pq_add(pq, &newelement);
        }
    }
    roaring_pq_element_t X = pq_poll(pq);
    roaring_bitmap_t *answer = X.bitmap;
    roaring_bitmap_repair_after_lazy(answer);
    pq_free(pq);
    return answer;
}